

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  cp_info *constantPool;
  int __status;
  bool bVar2;
  MethodArea *this;
  ClassRuntime *this_00;
  ClassFile *pCVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  ExecutionEngine *this_01;
  ostream *poVar6;
  char *__filename;
  string fileName;
  string className;
  allocator local_40 [32];
  
  if (argc - 4U < 0xfffffffe) {
    puts("Uso:");
    puts("\t./JVM arquivo_class.class \t ou,");
    puts("\t./JVM arquivo_class.class arquivo_saida.txt");
  }
  else {
    pcVar1 = argv[1];
    if ((uint)argc < 3) {
      __filename = (char *)0x0;
    }
    else {
      __filename = argv[2];
    }
    this = MethodArea::getInstance();
    std::__cxx11::string::string((string *)&className,pcVar1,(allocator *)&fileName);
    this_00 = MethodArea::loadClassNamed(this,&className);
    std::__cxx11::string::~string((string *)&className);
    pCVar3 = ClassRuntime::getClassFile(this_00);
    constantPool = pCVar3->constant_pool;
    pCVar3 = ClassRuntime::getClassFile(this_00);
    pcVar4 = getFormattedConstant(constantPool,pCVar3->this_class);
    std::__cxx11::string::string((string *)&className,pcVar4,(allocator *)&fileName);
    std::__cxx11::string::string((string *)&fileName,pcVar1,local_40);
    lVar5 = std::__cxx11::string::find((char *)&fileName,0x126004);
    if (lVar5 != -1) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)&fileName);
      std::__cxx11::string::operator=((string *)&fileName,(string *)local_40);
      std::__cxx11::string::~string((string *)local_40);
    }
    bVar2 = std::operator!=(&className,&fileName);
    if (!bVar2) {
      if (__filename == (char *)0x0) {
        this_01 = ExecutionEngine::getInstance();
        ExecutionEngine::startExecutionEngine(this_01,this_00);
LAB_001107dc:
        std::__cxx11::string::~string((string *)&fileName);
        std::__cxx11::string::~string((string *)&className);
        return 0;
      }
      __stream = fopen(__filename,"w+");
      if (__stream != (FILE *)0x0) {
        pCVar3 = ClassRuntime::getClassFile(this_00);
        printClassFile(pCVar3,(FILE *)__stream);
        fclose(__stream);
        goto LAB_001107dc;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"Erro ao abrir arquivo ");
      poVar6 = std::operator<<(poVar6,__filename);
      poVar6 = std::operator<<(poVar6,".");
      std::endl<char,std::char_traits<char>>(poVar6);
      __status = 2;
      goto LAB_00110824;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"Nome do arquivo diferente do nome da classe.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  __status = 1;
LAB_00110824:
  exit(__status);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2 || argc > 3) {
        printf("Uso:\n");
        printf("\t./JVM arquivo_class.class \t ou,\n");
        printf("\t./JVM arquivo_class.class arquivo_saida.txt\n");
        exit(1);
    }
    
	const char *file_className = argv[1];
	const char *file_output = (argc < 3) ? NULL : argv[2];
    
    // Carregamento da classe de entrada.
    MethodArea &methodArea = MethodArea::getInstance();
    ClassRuntime *classRuntime = methodArea.loadClassNamed(file_className);
    // Fim do carregamento.
    
    // Verificação se o nome da classe de entrada é igual ao nome do arquivo.
    string className = getFormattedConstant(classRuntime->getClassFile()->constant_pool, classRuntime->getClassFile()->this_class);
    string fileName(file_className);
    if (fileName.find(".class") != fileName.npos) {
        fileName = fileName.substr(0, fileName.size() - 6);
    }
    if (className != fileName) {
        cerr << "Nome do arquivo diferente do nome da classe." << endl;
        exit(1);
    }
    // Fim da verificação
    
    // Salvando a estrutura do .class em um arquivo de saída ou realizando a execução da classe.
    if (file_output) {
        FILE *output = fopen(file_output, "w+");
        if (output == NULL) {
            cerr << "Erro ao abrir arquivo " << file_output << "." << endl;
            exit(2);
        }
        printClassFile(classRuntime->getClassFile(), output);
        fclose(output);
    } else {
        ExecutionEngine &executionEngine = ExecutionEngine::getInstance();
        executionEngine.startExecutionEngine(classRuntime);
    }
    
    return 0;
}